

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
::try_emplace_impl<std::basic_string_view<char,std::char_traits<char>>,unsigned_long>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,basic_string_view<char,_std::char_traits<char>_> *k,
          unsigned_long *args)

{
  iterator iter;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>::iterator,_bool>
  *res;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  anon_union_8_1_a8a14541_for_iterator_2 local_28;
  unsigned_long *local_20;
  unsigned_long *args_local;
  basic_string_view<char,_std::char_traits<char>_> *k_local;
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_local;
  
  local_20 = args;
  args_local = &k->_M_len;
  k_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  ::find_or_prepare_insert<std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
              *)this,k);
  if ((__return_storage_ptr__->second & 1U) != 0) {
    local_38._M_str = (__return_storage_ptr__->first).ctrl_;
    local_28 = (anon_union_8_1_a8a14541_for_iterator_2)(__return_storage_ptr__->first).field_1.slot_
    ;
    std::forward_as_tuple<std::basic_string_view<char,std::char_traits<char>>>(&local_38);
    std::forward_as_tuple<unsigned_long>((unsigned_long *)&res);
    iter.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)
                   (anon_union_8_1_a8a14541_for_iterator_2)local_28.slot_;
    iter.ctrl_ = local_38._M_str;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>&&>,std::tuple<unsigned_long&&>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                *)this,iter,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_38,
               (tuple<unsigned_long_&&> *)&res);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }